

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kqueue.c
# Opt level: O0

int kqueue(void)

{
  kqueue_head kVar1;
  int iVar2;
  kqueue *kq_00;
  int prev_cancel_state;
  kqueue *kq;
  int local_14;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pthread_mutex_lock((pthread_mutex_t *)&kq_mtx);
  pthread_once(&kq_is_initialized,libkqueue_init);
  pthread_mutex_unlock((pthread_mutex_t *)&kq_mtx);
  pthread_setcancelstate(1,&local_14);
  kq_00 = (kqueue *)calloc(1,0x1fe0);
  if (kq_00 != (kqueue *)0x0) {
    pthread_mutex_init((pthread_mutex_t *)&kq_00->kq_mtx,(pthread_mutexattr_t *)0x0);
    pthread_mutex_lock((pthread_mutex_t *)&kq_mtx);
    iVar2 = linux_kqueue_init((kqueue *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (iVar2 < 0) {
      pthread_mutex_unlock((pthread_mutex_t *)&kq_mtx);
    }
    else {
      kqueue_free_by_id((int)((ulong)kq_00 >> 0x20));
      iVar2 = map_insert(kqmap,kq_00->kq_id,kq_00);
      kVar1 = kq_list;
      if (-1 < iVar2) {
        (kq_00->kq_entry).le_next = kq_list.lh_first;
        if (kVar1.lh_first != (kqueue *)0x0) {
          ((kq_list.lh_first)->kq_entry).le_prev = &(kq_00->kq_entry).le_next;
        }
        kq_list.lh_first = kq_00;
        (kq_00->kq_entry).le_prev = &kq_list.lh_first;
        kq_cnt = kq_cnt + 1;
        pthread_mutex_unlock((pthread_mutex_t *)&kq_mtx);
        pthread_setcancelstate(local_14,(int *)0x0);
        if (local_14 == 0) {
          pthread_testcancel();
        }
        return kq_00->kq_id;
      }
      filter_unregister_all(kq_00);
      pthread_mutex_unlock((pthread_mutex_t *)&kq_mtx);
    }
    pthread_mutex_destroy((pthread_mutex_t *)&kq_00->kq_mtx);
    free(kq_00);
    pthread_setcancelstate(local_14,(int *)0x0);
  }
  return -1;
}

Assistant:

int VISIBLE
kqueue(void)
{
    struct kqueue *kq;

#ifdef _WIN32
    if (InterlockedCompareExchange(&kq_init_begin, 0, 1) == 0) {
        libkqueue_init();
    } else {
        while (kq_init_complete == 0) {
            sleep(1);
        }
    }

    tracing_mutex_init(&kq_mtx, NULL);
#else
    int prev_cancel_state;
    tracing_mutex_lock(&kq_mtx);
    (void) pthread_once(&kq_is_initialized, libkqueue_init);
    tracing_mutex_unlock(&kq_mtx);
#endif

#ifndef _WIN32
    pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &prev_cancel_state);
#endif
    kq = calloc(1, sizeof(*kq));
    if (kq == NULL)
        return (-1);

    tracing_mutex_init(&kq->kq_mtx, NULL);

    /*
     * Init, delete and insert should be atomic
     * this is mainly for the monitoring thread
     * on Linux, to ensure if an FD gets reused
     * for a new KQ, the signal handler doesn't
     * accidentally free up memory allocated to
     * the new KQ.
     */
    tracing_mutex_lock(&kq_mtx);
    if (kqops.kqueue_init(kq) < 0) {
        tracing_mutex_unlock(&kq_mtx);
    error:
        dbg_printf("kq=%p - init failed", kq);
        tracing_mutex_destroy(&kq->kq_mtx);
        free(kq);
#ifndef _WIN32
        pthread_setcancelstate(prev_cancel_state, NULL);
#endif
        return (-1);
    }

    dbg_printf("kq=%p - alloced with fd=%d", kq, kq->kq_id);

    kqueue_free_by_id(kq->kq_id);   /* Free any old map entries */

    if (map_insert(kqmap, kq->kq_id, kq) < 0) {
        dbg_printf("kq=%p - map insertion failed, freeing", kq);
        filter_unregister_all(kq);
        tracing_mutex_unlock(&kq_mtx);
        goto error;
    }
    LIST_INSERT_HEAD(&kq_list, kq, kq_entry);
    kq_cnt++;
    tracing_mutex_unlock(&kq_mtx);
#ifndef _WIN32
    pthread_setcancelstate(prev_cancel_state, NULL);
    if (prev_cancel_state == PTHREAD_CANCEL_ENABLE)
        pthread_testcancel();
#endif

    return (kq->kq_id);
}